

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O0

void __thiscall
InlineTable_WithNumericKey_Test::InlineTable_WithNumericKey_Test
          (InlineTable_WithNumericKey_Test *this)

{
  InlineTable_WithNumericKey_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__InlineTable_WithNumericKey_Test_00229cb0;
  return;
}

Assistant:

TEST(InlineTable, WithNumericKey) {
    std::istringstream input("key = { 123=\t123   } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "123"},
        {sax_event_t::integer, 123},
        {sax_event_t::finish_inline_table, 1},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}